

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

void ZopfliCacheToSublen(ZopfliLongestMatchCache *lmc,size_t pos,size_t length,
                        unsigned_short *sublen)

{
  ulong uVar1;
  byte bVar2;
  unsigned_short uVar3;
  uchar *puVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar5 = ZopfliMaxCachedSublen(lmc,pos,length);
  if (2 < length) {
    puVar4 = lmc->sublen;
    uVar7 = 0;
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
      bVar2 = puVar4[lVar6 * 3 + pos * 0x18];
      uVar1 = (ulong)bVar2 + 3;
      uVar3 = *(unsigned_short *)(puVar4 + lVar6 * 3 + pos * 0x18 + 1);
      for (uVar8 = (ulong)uVar7; uVar8 <= uVar1; uVar8 = uVar8 + 1) {
        sublen[uVar8] = uVar3;
      }
      if ((uint)uVar1 == uVar5) {
        return;
      }
      uVar7 = bVar2 + 4;
    }
  }
  return;
}

Assistant:

void ZopfliCacheToSublen(const ZopfliLongestMatchCache* lmc,
                         size_t pos, size_t length,
                         unsigned short* sublen) {
  size_t i, j;
  unsigned maxlength = ZopfliMaxCachedSublen(lmc, pos, length);
  unsigned prevlength = 0;
  unsigned char* cache;
#if ZOPFLI_CACHE_LENGTH == 0
  return;
#endif
  if (length < 3) return;
  cache = &lmc->sublen[ZOPFLI_CACHE_LENGTH * pos * 3];
  for (j = 0; j < ZOPFLI_CACHE_LENGTH; j++) {
    unsigned length = cache[j * 3] + 3;
    unsigned dist = cache[j * 3 + 1] + 256 * cache[j * 3 + 2];
    for (i = prevlength; i <= length; i++) {
      sublen[i] = dist;
    }
    if (length == maxlength) break;
    prevlength = length + 1;
  }
}